

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ScanImplicitRoots(Recycler *this)

{
  if (this->enableScanImplicitRoots == true) {
    if (this->hasScannedInitialImplicitRoots != false) {
      HeapInfoManager::ScanNewImplicitRoots(&this->autoHeap);
      return;
    }
    HeapInfoManager::ScanInitialImplicitRoots(&this->autoHeap);
    this->hasScannedInitialImplicitRoots = true;
  }
  return;
}

Assistant:

void
Recycler::ScanImplicitRoots()
{
    if (this->enableScanImplicitRoots)
    {
        RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FindImplicitRootPhase);
        if (!this->hasScannedInitialImplicitRoots)
        {
            this->ScanInitialImplicitRoots();
            this->hasScannedInitialImplicitRoots = true;
        }
        else
        {
            this->ScanNewImplicitRoots();
        }
        RECYCLER_PROFILE_EXEC_END(this, Js::FindImplicitRootPhase);
    }
}